

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O2

ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> * __thiscall
flow::IRProgram::
get<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,flow::util::RegExp>
          (IRProgram *this,
          vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
          *table,RegExp *literal)

{
  pointer puVar1;
  __type_conflict2 _Var2;
  pointer puVar3;
  long lVar4;
  long lVar5;
  RegExp local_70;
  
  puVar3 = (table->
           super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  puVar1 = (table->
           super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = 0;
  lVar4 = 0;
  do {
    if ((long)puVar3 - (long)puVar1 >> 3 == lVar4) {
      std::
      make_unique<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,flow::util::RegExp_const&>
                (&local_70);
      std::
      vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,std::default_delete<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>>>,std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,std::default_delete<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>>>>>
      ::
      emplace_back<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,std::default_delete<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>>>>
                ((vector<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,std::default_delete<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>>>,std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,std::default_delete<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>>>>>
                  *)table,(unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>
                           *)&local_70);
      if ((long *)local_70.pattern_._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_70.pattern_._M_dataplus._M_p + 8))();
      }
      puVar3 = (table->
               super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish + -1;
LAB_00141761:
      return (puVar3->_M_t).
             super___uniq_ptr_impl<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_*,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>
             .
             super__Head_base<0UL,_flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_*,_false>
             ._M_head_impl;
    }
    util::RegExp::RegExp
              (&local_70,
               (RegExp *)
               ((long)(table->
                      super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[lVar4]._M_t.
                      super___uniq_ptr_impl<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>
                      ._M_t + 0x48));
    _Var2 = std::operator==(&local_70.pattern_,&literal->pattern_);
    util::RegExp::~RegExp(&local_70);
    if (_Var2) {
      puVar3 = (pointer)((long)(table->
                               super__Vector_base<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>,_std::default_delete<flow::ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start - lVar5);
      goto LAB_00141761;
    }
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + -8;
  } while( true );
}

Assistant:

T* IRProgram::get(std::vector<std::unique_ptr<T>>& table, const U& literal) {
  for (size_t i = 0, e = table.size(); i != e; ++i)
    if (table[i]->get() == literal)
      return table[i].get();

  table.emplace_back(std::make_unique<T>(literal));
  return table.back().get();
}